

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_map.h
# Opt level: O0

bool __thiscall CDoodadsMapper::CRule::operator<(CRule *this,CRule *Other)

{
  CRule *Other_local;
  CRule *this_local;
  
  if (((this->m_Location == 0) && (Other->m_Location == 0)) ||
     ((this->m_Location == 1 && (Other->m_Location == 1)))) {
    if ((this->m_Size).field_0.x < (Other->m_Size).field_0.x) {
      return true;
    }
  }
  else if (((this->m_Location == 2) && (Other->m_Location == 2)) &&
          ((this->m_Size).field_1.y < (Other->m_Size).field_1.y)) {
    return true;
  }
  return false;
}

Assistant:

bool operator<(const CRule &Other) const
		{
			if((m_Location == CDoodadsMapper::CRule::FLOOR && Other.m_Location == CDoodadsMapper::CRule::FLOOR)
				|| (m_Location == CDoodadsMapper::CRule::CEILING && Other.m_Location == CDoodadsMapper::CRule::CEILING))
			{
				if(m_Size.x < Other.m_Size.x)
					return true;
			}
			else if(m_Location == CDoodadsMapper::CRule::WALLS && Other.m_Location == CDoodadsMapper::CRule::WALLS)
			{
				if(m_Size.y < Other.m_Size.y)
					return true;
			}

			return false;
		}